

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Statement * __thiscall soul::StructuralParser::parseIf(StructuralParser *this)

{
  bool bVar1;
  Expression *args_2;
  Block *args_3;
  IfStatement *pIVar2;
  bool isConst;
  pool_ptr<soul::AST::Statement> falseBranch;
  Context context;
  bool local_41;
  pool_ptr<soul::AST::Statement> local_40;
  Context local_38;
  
  local_38.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_38.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_38.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_38.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_38.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_38.parentScope = this->currentScope;
  local_41 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
             ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b2b1);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6d5);
  args_2 = parseExpression(this,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
  args_3 = parseStatementAsNewBlock(this);
  local_40.object = (Statement *)0x0;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b701);
  if (bVar1) {
    local_40.object = &parseStatementAsNewBlock(this)->super_Statement;
  }
  pIVar2 = PoolAllocator::
           allocate<soul::AST::IfStatement,soul::AST::Context&,bool&,soul::AST::Expression&,soul::AST::Block&,soul::pool_ptr<soul::AST::Statement>&>
                     (&this->allocator->pool,&local_38,&local_41,args_2,args_3,&local_40);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_38.location.sourceCode.object);
  return &pIVar2->super_Statement;
}

Assistant:

AST::Statement& parseIf()
    {
        auto context = getContext();
        bool isConst = matchIf (Keyword::const_);
        expect (Operator::openParen);
        auto& condition = matchCloseParen (parseExpression());
        auto& trueBranch = parseStatementAsNewBlock();
        pool_ptr<AST::Statement> falseBranch;

        if (matchIf (Keyword::else_))
            falseBranch = parseStatementAsNewBlock();

        return allocate<AST::IfStatement> (context, isConst, condition, trueBranch, falseBranch);
    }